

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void pre_out(c2m_ctx_t c2m_ctx,token_t t)

{
  byte bVar1;
  char cVar2;
  undefined1 uVar3;
  token_t ptVar4;
  VARR_token_t *pVVar5;
  byte *pbVar6;
  byte *pbVar7;
  MIR_context_t pMVar8;
  FILE *__stream;
  pos_t pVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  c2m_ctx_t __size;
  token_t *pptVar13;
  ulong uVar14;
  char *pcVar15;
  c2mir_options *pcVar16;
  void *pvVar17;
  size_t sVar18;
  int *piVar19;
  node_t_conflict n;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  int extraout_EDX;
  c2m_ctx_t pcVar23;
  c2m_ctx_t pcVar24;
  c2m_ctx_t format;
  c2m_ctx_t pcVar25;
  c2m_ctx_t __ptr;
  code *pcVar26;
  char cVar27;
  byte bVar28;
  VARR_char *pVVar29;
  c2m_ctx_t pcVar30;
  char *pcVar31;
  VARR_char *unaff_R13;
  long lVar32;
  size_t sVar33;
  c2m_ctx_t pcVar34;
  bool bVar35;
  longdouble in_ST0;
  float fVar36;
  double dVar37;
  str_t sVar38;
  int iStack_ec;
  int iStack_e8;
  uint uStack_e4;
  char *pcStack_e0;
  int iStack_d4;
  tab_str_t tStack_c0;
  c2m_ctx_t pcStack_a0;
  VARR_char *pVStack_98;
  VARR_char *pVStack_90;
  c2m_ctx_t pcStack_88;
  c2m_ctx_t pcStack_80;
  c2m_ctx_t pcStack_78;
  c2m_ctx_t pcStack_68;
  c2m_ctx_t pcStack_60;
  c2m_ctx_t pcStack_58;
  c2m_ctx_t pcStack_50;
  int local_44;
  c2m_ctx_t local_40;
  VARR_char *local_38;
  
  if (t == (token_t)0x0) {
    ptVar4 = c2m_ctx->pre_ctx->pre_last_token;
    if (ptVar4 == (token_t)0x0) {
      lVar32 = -1;
      pcVar15 = (char *)0x0;
    }
    else {
      pcVar15 = (ptVar4->pos).fname;
      lVar32._0_4_ = (ptVar4->pos).lno;
      lVar32._4_4_ = (ptVar4->pos).ln_pos;
    }
    pcStack_50 = (c2m_ctx_t)0x1919aa;
    __size = (c2m_ctx_t)reg_malloc(c2m_ctx,0x30);
    *(undefined4 *)&__size->ctx = 0x13d;
    ((pos_t *)&__size->options)->fname = pcVar15;
    __size->env[0].__jmpbuf[0] = lVar32;
    __size->env[0].__jmpbuf[3] = (long)"<EOF>";
    *(undefined4 *)(__size->env[0].__jmpbuf + 1) = 0;
    __size->env[0].__jmpbuf[2] = 0;
  }
  else {
    if ((*(short *)t == -1) || (*(short *)t == 0x147)) goto LAB_00191e9f;
    c2m_ctx->pre_ctx->pre_last_token = t;
    pcStack_50 = (c2m_ctx_t)0x191970;
    __size = (c2m_ctx_t)pptoken2token(c2m_ctx,t,1);
    if (__size == (c2m_ctx_t)0x0) {
      return;
    }
  }
  if (*(short *)&__size->ctx == 0x102) {
    pVVar5 = c2m_ctx->recorded_tokens;
    if (pVVar5 == (VARR_token_t *)0x0) goto LAB_00191ec3;
    sVar33 = pVVar5->els_num;
    if (sVar33 == 0) goto LAB_00191aa2;
    pptVar13 = pVVar5->varr;
    if (pptVar13 == (token_t *)0x0) goto LAB_00191ed2;
    if (*(short *)pptVar13[sVar33 - 1] != 0x102) goto LAB_00191aa2;
    pVVar5->els_num = sVar33 - 1;
    pVVar29 = c2m_ctx->temp_string;
    if ((pVVar29 != (VARR_char *)0x0) && (pVVar29->varr != (char *)0x0)) {
      pcVar34 = (c2m_ctx_t)pptVar13[sVar33 - 1];
      pVVar29->els_num = 0;
      pbVar6 = (byte *)pcVar34->env[0].__jmpbuf[3];
      bVar28 = *pbVar6;
      if ((bVar28 == 0x4c) || (bVar28 == 0x55)) {
LAB_00191b21:
        pbVar7 = (byte *)__size->env[0].__jmpbuf[3];
        bVar1 = *pbVar7;
        pcVar24 = (c2m_ctx_t)&DAT_00000001;
        if (bVar1 == 0x22) {
LAB_00191b33:
          bVar35 = false;
        }
        else {
          bVar35 = true;
          if (bVar1 == bVar28) {
            bVar35 = pbVar7[1] == 0x38;
          }
        }
      }
      else {
        if (bVar28 != 0x75) {
          pcVar24 = (c2m_ctx_t)0x0;
          goto LAB_00191b33;
        }
        if (pbVar6[1] != 0x38) goto LAB_00191b21;
        pcVar15 = (char *)__size->env[0].__jmpbuf[3];
        cVar27 = *pcVar15;
        pcVar24 = (c2m_ctx_t)&DAT_00000002;
        if (cVar27 == '\"') goto LAB_00191b33;
        if (cVar27 == 'u') {
          bVar35 = pcVar15[1] != '8';
        }
        else {
          bVar35 = true;
        }
      }
      pbVar7 = (byte *)__size->env[0].__jmpbuf[3];
      bVar1 = *pbVar7;
      format = (c2m_ctx_t)(ulong)bVar1;
      if ((bVar1 == 0x4c) || (bVar1 == 0x55)) {
LAB_00191b9e:
        pVVar29 = (VARR_char *)&DAT_00000001;
        if (bVar28 == 0x22) {
LAB_00191ba9:
          bVar35 = false;
        }
        else {
          bVar35 = true;
          if (bVar1 == bVar28) {
            bVar35 = pbVar6[1] == 0x38;
          }
        }
      }
      else {
        if (bVar1 == 0x75) {
          if (pbVar7[1] != 0x38) goto LAB_00191b9e;
          pVVar29 = (VARR_char *)&DAT_00000002;
          if (bVar28 != 0x22) {
            if (bVar28 == 0x75) {
              bVar35 = pbVar6[1] != 0x38;
            }
            else {
              bVar35 = true;
            }
            goto LAB_00191bbf;
          }
          goto LAB_00191ba9;
        }
        pVVar29 = (VARR_char *)0x0;
      }
LAB_00191bbf:
      if (bVar35) {
        format = (c2m_ctx_t)((pos_t *)&__size->options)->fname;
        pcStack_50 = (c2m_ctx_t)0x191bdc;
        error(c2m_ctx,0x1c2ca2,(char *)format,__size->env[0].__jmpbuf[0]);
      }
      pcVar15 = (char *)pcVar34->env[0].__jmpbuf[3];
      cVar27 = *pcVar15;
      local_44 = 0x4c;
      if (cVar27 == 'L') {
LAB_00191bfe:
        bVar35 = false;
      }
      else {
        format = (c2m_ctx_t)__size->env[0].__jmpbuf[3];
        cVar2 = *(char *)&format->ctx;
        if (cVar2 == 'L') goto LAB_00191bfe;
        bVar35 = false;
        local_44 = 0x55;
        if ((cVar27 != 'U') && (cVar2 != 'U')) {
          if (((cVar27 == 'u') && (pcVar15[1] == '8')) ||
             ((cVar2 == 'u' && (*(char *)((long)&format->ctx + 1) == '8')))) {
            format = (c2m_ctx_t)0x75;
            pcStack_50 = (c2m_ctx_t)0x191e64;
            VARR_charpush(c2m_ctx->temp_string,'u');
            local_44 = 0x38;
            goto LAB_00191bfe;
          }
          bVar35 = cVar27 != 'u' && cVar2 != 'u';
          local_44 = 0x75;
          if (cVar27 != 'u' && cVar2 != 'u') {
            local_44 = 0x20;
          }
        }
      }
      local_38 = pVVar29;
      if (!bVar35) {
        unaff_R13 = c2m_ctx->temp_string;
        __ptr = (c2m_ctx_t)unaff_R13->varr;
        if (__ptr != (c2m_ctx_t)0x0) {
          uVar14 = unaff_R13->els_num + 1;
          if (unaff_R13->size < uVar14) {
            pcVar30 = (c2m_ctx_t)((uVar14 >> 1) + uVar14);
            pcStack_50 = (c2m_ctx_t)0x191c3b;
            format = pcVar30;
            pcVar15 = (char *)realloc(__ptr,(size_t)pcVar30);
            unaff_R13->varr = pcVar15;
            unaff_R13->size = (size_t)pcVar30;
          }
          sVar33 = unaff_R13->els_num;
          unaff_R13->els_num = sVar33 + 1;
          unaff_R13->varr[sVar33] = (char)local_44;
          goto LAB_00191c5a;
        }
LAB_00191f1f:
        pcStack_50 = (c2m_ctx_t)stringify;
        pre_out_cold_1();
        pcVar23 = c2m_ctx;
        pcVar25 = format;
        pcVar30 = __ptr;
        pcStack_68 = c2m_ctx;
        pcStack_60 = pcVar34;
        pcStack_58 = __size;
        pcStack_50 = pcVar24;
        if ((format != (c2m_ctx_t)0x0) &&
           (pcVar30 = (c2m_ctx_t)format->env[0].__jmpbuf[0], pcVar23 = format, pcVar34 = __ptr,
           pcVar30 != (c2m_ctx_t)0x0)) {
          format->ctx = (MIR_context_t)0x0;
          if (((pos_t *)&format->options)->fname == (char *)0x0) {
            pcVar25 = (c2m_ctx_t)&DAT_00000001;
            pcStack_78 = (c2m_ctx_t)0x191f5f;
            pvVar17 = realloc(pcVar30,1);
            format->env[0].__jmpbuf[0] = (long)pvVar17;
            ((pos_t *)&format->options)->fname = (char *)0x1;
          }
          pMVar8 = format->ctx;
          format->ctx = (MIR_context_t)((long)&pMVar8->gen_ctx + 1);
          *(undefined1 *)((long)&pMVar8->gen_ctx + format->env[0].__jmpbuf[0]) = 0x22;
          while( true ) {
            cVar27 = *(char *)&__ptr->ctx;
            pcVar34 = __ptr;
            if ((cVar27 == '\"') || (cVar27 == '\\')) {
              pcVar30 = (c2m_ctx_t)format->env[0].__jmpbuf[0];
              if (pcVar30 == (c2m_ctx_t)0x0) goto LAB_00192077;
              pcVar15 = (char *)((long)&format->ctx->gen_ctx + 1);
              if (((pos_t *)&format->options)->fname < pcVar15) {
                __size = (c2m_ctx_t)(pcVar15 + ((ulong)pcVar15 >> 1));
                pcStack_78 = (c2m_ctx_t)0x191fbe;
                pcVar25 = __size;
                pvVar17 = realloc(pcVar30,(size_t)__size);
                format->env[0].__jmpbuf[0] = (long)pvVar17;
                ((pos_t *)&format->options)->fname = (char *)__size;
              }
              pMVar8 = format->ctx;
              format->ctx = (MIR_context_t)((long)&pMVar8->gen_ctx + 1);
              *(undefined1 *)((long)&pMVar8->gen_ctx + format->env[0].__jmpbuf[0]) = 0x5c;
            }
            else if (cVar27 == '\0') {
              pcVar30 = (c2m_ctx_t)format->env[0].__jmpbuf[0];
              if (pcVar30 != (c2m_ctx_t)0x0) {
                pcVar15 = (char *)((long)&format->ctx->gen_ctx + 1);
                if (((pos_t *)&format->options)->fname < pcVar15) {
                  pcStack_78 = (c2m_ctx_t)0x19204d;
                  pvVar17 = realloc(pcVar30,(size_t)(pcVar15 + ((ulong)pcVar15 >> 1)));
                  format->env[0].__jmpbuf[0] = (long)pvVar17;
                  ((pos_t *)&format->options)->fname = pcVar15 + ((ulong)pcVar15 >> 1);
                }
                pMVar8 = format->ctx;
                format->ctx = (MIR_context_t)((long)&pMVar8->gen_ctx + 1);
                *(undefined1 *)((long)&pMVar8->gen_ctx + format->env[0].__jmpbuf[0]) = 0x22;
                return;
              }
              goto LAB_00192081;
            }
            pcVar30 = (c2m_ctx_t)format->env[0].__jmpbuf[0];
            if (pcVar30 == (c2m_ctx_t)0x0) break;
            uVar3 = *(undefined1 *)&__ptr->ctx;
            pcVar24 = (c2m_ctx_t)CONCAT71((int7)((ulong)pcVar24 >> 8),uVar3);
            pcVar15 = (char *)((long)&format->ctx->gen_ctx + 1);
            if (((pos_t *)&format->options)->fname < pcVar15) {
              __size = (c2m_ctx_t)(pcVar15 + ((ulong)pcVar15 >> 1));
              pcStack_78 = (c2m_ctx_t)0x192005;
              pcVar25 = __size;
              pvVar17 = realloc(pcVar30,(size_t)__size);
              format->env[0].__jmpbuf[0] = (long)pvVar17;
              ((pos_t *)&format->options)->fname = (char *)__size;
            }
            pMVar8 = format->ctx;
            format->ctx = (MIR_context_t)((long)&pMVar8->gen_ctx + 1);
            *(undefined1 *)((long)&pMVar8->gen_ctx + format->env[0].__jmpbuf[0]) = uVar3;
            __ptr = (c2m_ctx_t)((long)&__ptr->ctx + 1);
          }
          pcStack_78 = (c2m_ctx_t)0x192077;
          stringify_cold_3();
LAB_00192077:
          pcStack_78 = (c2m_ctx_t)0x19207c;
          stringify_cold_1();
        }
        pcStack_78 = (c2m_ctx_t)0x192081;
        stringify_cold_4();
LAB_00192081:
        pcStack_78 = (c2m_ctx_t)pptoken2token;
        stringify_cold_2();
        uVar20 = (*(uint *)&pcVar25->ctx & 0xffff) - 0x13d;
        pcStack_a0 = pcVar23;
        pVStack_98 = pVVar29;
        pVStack_90 = unaff_R13;
        pcStack_88 = pcVar34;
        pcStack_80 = __size;
        pcStack_78 = pcVar24;
        if (uVar20 < 0xb) {
          if (uVar20 == 2) {
            *(uint *)&pcVar25->ctx = *(uint *)&pcVar25->ctx & 0xffff0103;
          }
          else if ((0x7f3U >> (uVar20 & 0x1f) & 1) != 0) {
            __assert_fail("t->code != T_HEADER && t->code != T_BOA && t->code != T_EOA && t->code != T_EOR && t->code != T_EOP && t->code != T_EOFILE && t->code != T_EOU && t->code != T_PLM && t->code != T_RDBLNO"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x732,"token_t pptoken2token(c2m_ctx_t, token_t, int)");
          }
        }
        iVar21 = *(int *)&pcVar25->ctx << 0x10;
        if (extraout_EDX != 0 && iVar21 == 0x1030000) {
          pcVar15 = (char *)pcVar25->env[0].__jmpbuf[3];
          sVar18 = strlen(pcVar15);
          str_add(&tStack_c0,pcVar30,pcVar15,sVar18 + 1,0x102,0,0);
          if (tStack_c0.key == 0x102) {
            return;
          }
          *(short *)&pcVar25->ctx = (short)tStack_c0.key;
          *(undefined4 *)(pcVar25->env[0].__jmpbuf + 1) = 0;
          pcVar25->env[0].__jmpbuf[2] = 0;
          return;
        }
        if (iVar21 == 0xa0000) {
          return;
        }
        if (iVar21 == 0x200000) {
          return;
        }
        if (iVar21 != 0x1000000) {
          return;
        }
        pcVar15 = (char *)pcVar25->env[0].__jmpbuf[3];
        sVar18 = strlen(pcVar15);
        iVar21 = (int)sVar18;
        if (iVar21 < 1) {
          __assert_fail("last >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x746,"token_t pptoken2token(c2m_ctx_t, token_t, int)");
        }
        pcStack_e0 = pcVar15;
        if (*pcVar15 == '0') {
          if ((byte)(pcVar15[1] | 0x20U) == 0x78) {
            iStack_d4 = 0x10;
            bVar35 = true;
            bVar28 = 0;
          }
          else {
            bVar28 = 1;
            if ((byte)(pcVar15[1] | 0x20U) != 0x62) {
              iStack_d4 = 8;
              goto LAB_001921b0;
            }
            pcVar26 = error;
            if (pcVar30->options->pedantic_p == 0) {
              pcVar26 = warning;
            }
            bVar35 = false;
            (*pcVar26)(pcVar30,((pos_t *)&pcVar25->options)->fname,pcVar25->env[0].__jmpbuf[0],
                       "binary number is not a standard: %s",pcVar15);
            iStack_d4 = 2;
            pcStack_e0 = pcVar15 + 2;
          }
        }
        else {
          iStack_d4 = 10;
LAB_001921b0:
          bVar28 = 1;
          bVar35 = false;
        }
        uStack_e4 = iVar21 - 1;
        uVar14 = 1;
        if (1 < iVar21) {
          uVar14 = sVar18 & 0xffffffff;
        }
        uVar22 = 0;
        bVar11 = false;
        do {
          bVar1 = pcVar15[uVar22];
          if (bVar1 < 0x65) {
            bVar10 = true;
            if ((bVar1 != 0x2e) && (bVar10 = true, bVar1 != 0x50)) {
LAB_00192203:
              bVar10 = bVar11;
              if ((bool)(bVar28 & bVar1 == 0x45)) {
LAB_00192212:
                bVar10 = true;
              }
            }
          }
          else if (bVar1 == 0x65) {
            bVar10 = bVar11;
            if (!bVar35) goto LAB_00192212;
          }
          else {
            bVar10 = true;
            if (bVar1 != 0x70) goto LAB_00192203;
          }
          uVar22 = uVar22 + 1;
          bVar11 = bVar10;
        } while (uVar14 != uVar22);
        if (iVar21 < 3) {
LAB_00192320:
          if (iVar21 == 1) {
LAB_0019232a:
            pcVar31 = pcVar15 + uStack_e4;
            iVar12 = strcmp(pcVar31,"L");
            if ((iVar12 == 0) || (iVar12 = strcmp(pcVar31,"l"), iVar12 == 0)) {
              uStack_e4 = iVar21 - 2;
              iStack_ec = 1;
              bVar11 = false;
              bVar1 = 0;
              iStack_e8 = 0;
              bVar35 = false;
            }
            else {
              iVar12 = strcmp(pcVar31,"U");
              if ((iVar12 == 0) || (iVar12 = strcmp(pcVar31,"u"), iVar12 == 0)) {
                bVar11 = false;
                iStack_e8 = 1;
                bVar1 = 1;
LAB_00192632:
                uStack_e4 = iVar21 - 2;
              }
              else {
                if (bVar10) {
                  iVar12 = strcmp(pcVar31,"F");
                  if ((iVar12 == 0) || (iVar12 = strcmp(pcVar31,"f"), iVar12 == 0)) {
                    bVar10 = false;
                    bVar11 = true;
                    bVar1 = 0;
                    iStack_e8 = 0;
                    goto LAB_00192632;
                  }
                  bVar10 = true;
                }
                else {
                  bVar10 = false;
                }
                bVar11 = false;
                bVar1 = 0;
                iStack_e8 = 0;
              }
              bVar35 = true;
              iStack_ec = 0;
            }
          }
          else {
            pcVar31 = pcVar15 + (iVar21 - 2);
            iVar12 = strcmp(pcVar31,"LL");
            if ((iVar12 == 0) || (iVar12 = strcmp(pcVar31,"ll"), iVar12 == 0)) {
              uStack_e4 = iVar21 - 3;
              iVar21 = 1;
              bVar35 = true;
              bVar11 = false;
              bVar1 = 0;
              iStack_e8 = 0;
              iStack_ec = 0;
              bVar28 = 1;
              goto LAB_00192678;
            }
            iVar12 = strcmp(pcVar31,"LU");
            if ((((iVar12 != 0) && (iVar12 = strcmp(pcVar31,"UL"), iVar12 != 0)) &&
                (iVar12 = strcmp(pcVar31,"lu"), iVar12 != 0)) &&
               (((iVar12 = strcmp(pcVar31,"ul"), iVar12 != 0 &&
                 (iVar12 = strcmp(pcVar31,"Lu"), iVar12 != 0)) &&
                ((iVar12 = strcmp(pcVar31,"uL"), iVar12 != 0 &&
                 ((iVar12 = strcmp(pcVar31,"lU"), iVar12 != 0 &&
                  (iVar12 = strcmp(pcVar31,"Ul"), iVar12 != 0)))))))) goto LAB_0019232a;
            uStack_e4 = iVar21 - 3;
            bVar11 = false;
            iStack_e8 = 1;
            bVar1 = 1;
            bVar35 = false;
            iStack_ec = 1;
          }
          bVar28 = 0;
          iVar21 = 0;
        }
        else {
          pcVar31 = pcVar15 + (iVar21 - 3);
          iVar12 = strcmp(pcVar31,"LLU");
          if (((((iVar12 != 0) && (iVar12 = strcmp(pcVar31,"ULL"), iVar12 != 0)) &&
               (iVar12 = strcmp(pcVar31,"llu"), iVar12 != 0)) &&
              ((iVar12 = strcmp(pcVar31,"ull"), iVar12 != 0 &&
               (iVar12 = strcmp(pcVar31,"LLu"), iVar12 != 0)))) &&
             ((iVar12 = strcmp(pcVar31,"uLL"), iVar12 != 0 &&
              ((iVar12 = strcmp(pcVar31,"llU"), iVar12 != 0 &&
               (iVar12 = strcmp(pcVar31,"Ull"), iVar12 != 0)))))) goto LAB_00192320;
          uStack_e4 = iVar21 - 4;
          bVar11 = false;
          iStack_e8 = 1;
          bVar1 = 1;
          bVar35 = true;
          iStack_ec = 0;
          bVar28 = 1;
          iVar21 = 1;
        }
LAB_00192678:
        if (bVar10) {
          if ((bool)(bVar1 | bVar28)) {
            bVar35 = false;
            error(pcVar30,0x1c2e28,((pos_t *)&pcVar25->options)->fname,pcVar25->env[0].__jmpbuf[0],
                  pcVar15);
            bVar28 = 1;
          }
          else {
            if (!bVar35) {
              bVar35 = true;
              bVar28 = 0;
              bVar10 = false;
              bVar1 = 1;
              goto LAB_001926d1;
            }
            bVar28 = 1;
            bVar35 = false;
          }
        }
        else {
          bVar35 = true;
          bVar28 = 0;
        }
        bVar10 = true;
        bVar1 = 0;
LAB_001926d1:
        piVar19 = __errno_location();
        *piVar19 = 0;
        if (bVar11) {
          fVar36 = strtof(pcStack_e0,(char **)&tStack_c0);
          pVar9 = *(pos_t *)&pcVar25->options;
          n = new_node(pcVar30,N_F);
          add_pos(pcVar30,n,pVar9);
          (n->u).f = fVar36;
        }
        else if (bVar35) {
          if (bVar10) {
            n = get_int_node_from_repr
                          (pcVar30,pcStack_e0,(char **)&tStack_c0,iStack_d4,iStack_e8,iStack_ec,
                           iVar21,*(pos_t *)&pcVar25->options);
          }
          else {
            strtold(pcStack_e0,(char **)&tStack_c0);
            n = new_ld_node(pcVar30,in_ST0,*(pos_t *)&pcVar25->options);
          }
        }
        else {
          dVar37 = strtod(pcStack_e0,(char **)&tStack_c0);
          pVar9 = *(pos_t *)&pcVar25->options;
          n = new_node(pcVar30,N_D);
          add_pos(pcVar30,n,pVar9);
          (n->u).d = dVar37;
        }
        pcVar25->env[0].__jmpbuf[2] = (long)n;
        if (tStack_c0.str.s == pcVar15 + (long)(int)uStack_e4 + 1) {
          if (*piVar19 != 0) {
            if ((bool)(bVar11 | bVar28 | bVar1)) {
              warning(pcVar30,0x1c2e43,((pos_t *)&pcVar25->options)->fname,
                      pcVar25->env[0].__jmpbuf[0],pcVar25->env[0].__jmpbuf[3]);
            }
            else {
              pcVar26 = error;
              if (pcVar30->options->pedantic_p == 0) {
                pcVar26 = warning;
              }
              (*pcVar26)(pcVar30,((pos_t *)&pcVar25->options)->fname,pcVar25->env[0].__jmpbuf[0],
                         "number %s is out of range",pcVar25->env[0].__jmpbuf[3]);
            }
          }
        }
        else {
          __stream = (FILE *)pcVar30->options->message_file;
          if (__stream != (FILE *)0x0) {
            fprintf(__stream,"%s:%s:%s\n",pcVar15);
          }
          error(pcVar30,0x1c2e28,((pos_t *)&pcVar25->options)->fname,pcVar25->env[0].__jmpbuf[0],
                pcVar25->env[0].__jmpbuf[3]);
        }
        return;
      }
LAB_00191c5a:
      lVar32 = pcVar34->env[0].__jmpbuf[3];
      cVar27 = *(char *)((long)pcVar24->env[0].__jmpbuf + lVar32 + -0x10);
      unaff_R13 = (VARR_char *)CONCAT71((int7)((ulong)unaff_R13 >> 8),cVar27);
      local_40 = pcVar34;
      if (cVar27 != '\0') {
        pcVar15 = (undefined1 *)((long)&pcVar24->ctx + 1) + lVar32;
        do {
          pcVar34 = (c2m_ctx_t)c2m_ctx->temp_string;
          pvVar17 = (void *)pcVar34->env[0].__jmpbuf[0];
          if (pvVar17 == (void *)0x0) {
            pcStack_50 = (c2m_ctx_t)0x191e9a;
            pre_out_cold_2();
            goto LAB_00191e9a;
          }
          pcVar16 = (c2mir_options *)((long)&pcVar34->ctx->gen_ctx + 1);
          if (pcVar34->options < pcVar16) {
            pcVar24 = (c2m_ctx_t)((long)&pcVar16->message_file + ((ulong)pcVar16 >> 1));
            pcStack_50 = (c2m_ctx_t)0x191ca2;
            format = pcVar24;
            pvVar17 = realloc(pvVar17,(size_t)pcVar24);
            pcVar34->env[0].__jmpbuf[0] = (long)pvVar17;
            pcVar34->options = (c2mir_options *)pcVar24;
          }
          pMVar8 = pcVar34->ctx;
          pcVar34->ctx = (MIR_context_t)((long)&pMVar8->gen_ctx + 1);
          *(char *)((long)&pMVar8->gen_ctx + pcVar34->env[0].__jmpbuf[0]) = (char)unaff_R13;
          cVar27 = *pcVar15;
          unaff_R13 = (VARR_char *)CONCAT71((int7)((ulong)unaff_R13 >> 8),cVar27);
          pcVar15 = pcVar15 + 1;
        } while (cVar27 != '\0');
      }
      pcVar24 = local_40;
      pVVar29 = c2m_ctx->temp_string;
      if (((pVVar29 == (VARR_char *)0x0) || (pVVar29->varr == (char *)0x0)) ||
         (sVar33 = pVVar29->els_num, sVar33 == 0)) goto LAB_00191ec8;
      if (pVVar29->varr[sVar33 - 1] != '\"') goto LAB_00191edc;
      pVVar29->els_num = sVar33 - 1;
      lVar32 = __size->env[0].__jmpbuf[3];
      cVar27 = *(char *)((long)&local_38->els_num + lVar32 + 1);
      if (cVar27 != '\0') {
        unaff_R13 = (VARR_char *)((undefined1 *)((long)&local_38->els_num + 2) + lVar32);
        do {
          pcVar34 = (c2m_ctx_t)c2m_ctx->temp_string;
          pvVar17 = (void *)pcVar34->env[0].__jmpbuf[0];
          if (pvVar17 == (void *)0x0) goto LAB_00191e9a;
          pcVar16 = (c2mir_options *)((long)&pcVar34->ctx->gen_ctx + 1);
          if (pcVar34->options < pcVar16) {
            __size = (c2m_ctx_t)((long)&pcVar16->message_file + ((ulong)pcVar16 >> 1));
            pcStack_50 = (c2m_ctx_t)0x191d50;
            format = __size;
            pvVar17 = realloc(pvVar17,(size_t)__size);
            pcVar34->env[0].__jmpbuf[0] = (long)pvVar17;
            pcVar34->options = (c2mir_options *)__size;
          }
          pMVar8 = pcVar34->ctx;
          pcVar34->ctx = (MIR_context_t)((long)&pMVar8->gen_ctx + 1);
          *(char *)((long)&pMVar8->gen_ctx + pcVar34->env[0].__jmpbuf[0]) = cVar27;
          cVar27 = (char)unaff_R13->els_num;
          unaff_R13 = (VARR_char *)((long)&unaff_R13->els_num + 1);
        } while (cVar27 != '\0');
      }
      pVVar29 = c2m_ctx->temp_string;
      if (((pVVar29 != (VARR_char *)0x0) &&
          (__ptr = (c2m_ctx_t)pVVar29->varr, __ptr != (c2m_ctx_t)0x0)) &&
         (sVar33 = pVVar29->els_num, sVar33 != 0)) {
        if (*(char *)((long)__ptr->env[0].__jmpbuf + (sVar33 - 0x11)) != '\"') {
          pcStack_50 = (c2m_ctx_t)0x191f1a;
          __assert_fail("VARR_LAST (char, temp_string) == \'\"\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0xf07,"void pre_out(c2m_ctx_t, token_t)");
        }
        uVar14 = sVar33 + 1;
        if (pVVar29->size < uVar14) {
          __size = (c2m_ctx_t)((uVar14 >> 1) + uVar14);
          pcStack_50 = (c2m_ctx_t)0x191dc7;
          format = __size;
          pcVar15 = (char *)realloc(__ptr,(size_t)__size);
          pVVar29->varr = pcVar15;
          pVVar29->size = (size_t)__size;
        }
        sVar33 = pVVar29->els_num;
        pVVar29->els_num = sVar33 + 1;
        pVVar29->varr[sVar33] = '\0';
        if (c2m_ctx->temp_string != (VARR_char *)0x0) {
          pcStack_50 = (c2m_ctx_t)0x191e02;
          sVar38 = uniq_cstr(c2m_ctx,c2m_ctx->temp_string->varr);
          pcVar24->env[0].__jmpbuf[3] = (long)sVar38.s;
          pcStack_50 = (c2m_ctx_t)0x191e1c;
          set_string_val(c2m_ctx,(token_t)pcVar24,c2m_ctx->temp_string,local_44);
          __size = pcVar24;
          goto LAB_00191aa2;
        }
        pcStack_50 = (c2m_ctx_t)0x191f1f;
        pre_out_cold_4();
        goto LAB_00191f1f;
      }
      goto LAB_00191ecd;
    }
  }
  else {
LAB_00191aa2:
    pVVar5 = c2m_ctx->recorded_tokens;
    if (pVVar5->varr != (token_t *)0x0) {
      uVar14 = pVVar5->els_num + 1;
      if (pVVar5->size < uVar14) {
        sVar33 = (uVar14 >> 1) + uVar14;
        pcStack_50 = (c2m_ctx_t)0x191ad8;
        pptVar13 = (token_t *)realloc(pVVar5->varr,sVar33 * 8);
        pVVar5->varr = pptVar13;
        pVVar5->size = sVar33;
      }
      sVar33 = pVVar5->els_num;
      pVVar5->els_num = sVar33 + 1;
      pVVar5->varr[sVar33] = (token_t)__size;
      return;
    }
    pcStack_50 = (c2m_ctx_t)0x191ec3;
    pre_out_cold_9();
LAB_00191ec3:
    pcStack_50 = (c2m_ctx_t)0x191ec8;
    pre_out_cold_10();
LAB_00191ec8:
    pcStack_50 = (c2m_ctx_t)0x191ecd;
    pre_out_cold_6();
LAB_00191ecd:
    pcStack_50 = (c2m_ctx_t)0x191ed2;
    pre_out_cold_5();
LAB_00191ed2:
    pcStack_50 = (c2m_ctx_t)0x191ed7;
    pre_out_cold_8();
  }
  pcStack_50 = (c2m_ctx_t)0x191edc;
  pre_out_cold_7();
LAB_00191edc:
  pcStack_50 = (c2m_ctx_t)0x191efb;
  __assert_fail("VARR_LAST (char, temp_string) == \'\"\'",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0xf03,"void pre_out(c2m_ctx_t, token_t)");
LAB_00191e9a:
  pcStack_50 = (c2m_ctx_t)0x191e9f;
  pre_out_cold_3();
LAB_00191e9f:
  pcStack_50 = (c2m_ctx_t)0x191ebe;
  __assert_fail("t->code != T_EOU && t->code != EOF",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0xeda,"void pre_out(c2m_ctx_t, token_t)");
}

Assistant:

static void pre_out (c2m_ctx_t c2m_ctx, token_t t) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;

  if (t == NULL) {
    t = new_token (c2m_ctx, pre_last_token == NULL ? no_pos : pre_last_token->pos, "<EOF>",
                   T_EOFILE, N_IGNORE);
  } else {
    assert (t->code != T_EOU && t->code != EOF);
    pre_last_token = t;
    if ((t = pptoken2token (c2m_ctx, t, TRUE)) == NULL) return;
  }
  if (t->code == T_STR && VARR_LENGTH (token_t, recorded_tokens) != 0
      && VARR_LAST (token_t, recorded_tokens)->code == T_STR) { /* concat strings */
    token_t last_t = VARR_POP (token_t, recorded_tokens);
    int type = ' ', last_t_quot_off = 0, t_quot_off = 0, err_p = FALSE;
    const char *s;

    VARR_TRUNC (char, temp_string, 0);
    if (last_t->repr[0] == 'u' && last_t->repr[1] == '8') {
      err_p = t->repr[0] != '\"' && (t->repr[0] != 'u' || t->repr[1] != '8');
      last_t_quot_off = 2;
    } else if (last_t->repr[0] == 'L' || last_t->repr[0] == 'u' || last_t->repr[0] == 'U') {
      err_p = t->repr[0] != '\"' && (t->repr[0] != last_t->repr[0] || t->repr[1] == '8');
      last_t_quot_off = 1;
    }
    if (t->repr[0] == 'u' && t->repr[1] == '8') {
      err_p = last_t->repr[0] != '\"' && (last_t->repr[0] != 'u' || last_t->repr[1] != '8');
      t_quot_off = 2;
    } else if (t->repr[0] == 'L' || t->repr[0] == 'u' || t->repr[0] == 'U') {
      err_p = last_t->repr[0] != '\"' && (t->repr[0] != last_t->repr[0] || last_t->repr[1] == '8');
      t_quot_off = 1;
    }
    if (err_p) error (c2m_ctx, t->pos, "concatenation of different type string literals");
    if (sizeof (mir_wchar) == 4 && (last_t->repr[0] == 'L' || t->repr[0] == 'L')) {
      type = 'L';
    } else if (last_t->repr[0] == 'U' || t->repr[0] == 'U') {
      type = 'U';
    } else if (last_t->repr[0] == 'L' || t->repr[0] == 'L') {
      type = 'L';
    } else if ((last_t->repr[0] == 'u' && last_t->repr[1] == '8')
               || (t->repr[0] == 'u' && t->repr[1] == '8')) {
      VARR_PUSH (char, temp_string, 'u');
      type = '8';
    } else if ((last_t->repr[0] == 'u' || t->repr[0] == 'u')) {
      type = 'u';
    }
    if (type != ' ') VARR_PUSH (char, temp_string, type);
    for (s = last_t->repr + last_t_quot_off; *s != 0; s++) VARR_PUSH (char, temp_string, *s);
    assert (VARR_LAST (char, temp_string) == '"');
    VARR_POP (char, temp_string);
    for (s = t->repr + t_quot_off + 1; *s != 0; s++) VARR_PUSH (char, temp_string, *s);
    t = last_t;
    assert (VARR_LAST (char, temp_string) == '"');
    VARR_PUSH (char, temp_string, '\0');
    t->repr = uniq_cstr (c2m_ctx, VARR_ADDR (char, temp_string)).s;
    set_string_val (c2m_ctx, t, temp_string, type);
  }
  VARR_PUSH (token_t, recorded_tokens, t);
}